

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

void double_conversion::FillDigits32(uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  piVar6 = buffer._8_8_;
  pcVar7 = buffer.start_;
  lVar4 = 0;
  if (number != 0) {
    do {
      pcVar7[lVar4 + *piVar6] = (char)number + (char)(number / 10) * -10 | 0x30;
      lVar4 = lVar4 + 1;
      bVar3 = 9 < number;
      number = number / 10;
    } while (bVar3);
  }
  iVar2 = *piVar6;
  lVar5 = (long)iVar2;
  iVar8 = iVar2 + (int)lVar4 + -1;
  if (iVar2 < iVar8) {
    lVar10 = (long)iVar8;
    do {
      lVar9 = lVar10 + -1;
      cVar1 = pcVar7[lVar5];
      pcVar7[lVar5] = pcVar7[lVar10];
      pcVar7[lVar10] = cVar1;
      lVar5 = lVar5 + 1;
      lVar10 = lVar9;
    } while (lVar5 < lVar9);
    iVar2 = *piVar6;
  }
  *piVar6 = (int)lVar4 + iVar2;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}